

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void Centaurus::MatchRoutineEM64T<char>::emit
               (X86Assembler *as,MyConstPool *pool,Label *rejectlabel,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  ulong uVar1;
  CodeEmitter *pCVar2;
  CodeEmitter *pCVar3;
  byte *pbVar4;
  ulong uVar5;
  long lVar6;
  unsigned_long *puVar7;
  undefined1 *puVar8;
  Data128 data;
  undefined4 in_stack_fffffffffffffd08;
  uint32_t in_stack_fffffffffffffd0c;
  CodeEmitter *in_stack_fffffffffffffd10;
  MyConstPool *in_stack_fffffffffffffd18;
  MyConstPool *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  int o1;
  Operand_ *in_stack_fffffffffffffd30;
  Operand_ *o0;
  undefined8 in_stack_fffffffffffffd38;
  MyConstPool *pMVar9;
  CodeEmitter *in_stack_fffffffffffffd40;
  Imm local_2b8;
  Imm local_2a8;
  CodeHolder *local_298;
  int64_t local_290;
  undefined1 local_288 [16];
  undefined1 local_278 [28];
  int j;
  Data128 d1;
  unsigned_long local_248;
  uint32_t local_240;
  uint32_t local_23c;
  int l1;
  int i_1;
  undefined4 local_230;
  undefined4 local_22c;
  undefined4 local_224;
  undefined8 uStack_220;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_local;
  Label *rejectlabel_local;
  MyConstPool *pool_local;
  X86Assembler *as_local;
  uint32_t signature_1;
  undefined4 local_1f4;
  size_t local_1f0;
  CodeEmitter *local_1e8;
  uint32_t local_1dc;
  size_t local_1d8;
  MyConstPool *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  MyConstPool *local_1c0;
  Gap *local_1b8;
  Gap *local_1b0;
  MyConstPool *local_1a8;
  uint local_19c;
  Gap *local_198;
  MyConstPool *local_190;
  int *local_188;
  anon_union_16_7_ed616b9d_for_Operand__0 local_180;
  undefined4 local_16c;
  undefined8 local_168;
  int *local_160;
  undefined4 local_158;
  undefined4 local_154;
  uint32_t signature;
  undefined4 local_14c;
  undefined8 local_148;
  Operand_ *local_140;
  undefined8 local_138;
  MyConstPool *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  MyConstPool *local_120;
  Imm *local_118;
  undefined1 *local_110;
  undefined8 local_108;
  MyConstPool *local_100;
  Imm *local_f8;
  undefined8 local_f0;
  MyConstPool *local_e8;
  undefined1 *local_e0;
  Operand_ *local_d8;
  undefined1 *local_d0;
  CodeEmitter *local_c8;
  undefined4 local_c0;
  undefined4 local_bc;
  Operand_ *local_b8;
  undefined4 local_b0;
  undefined4 local_ac;
  CodeEmitter *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  CodeEmitter *local_88;
  undefined1 *local_80;
  Operand_ *local_78;
  undefined4 local_70;
  undefined4 local_6c;
  CodeEmitter *local_68;
  undefined4 local_60;
  undefined4 local_5c;
  Operand_ *local_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_18;
  uint local_10;
  uint32_t local_c;
  
  uStack_220 = str;
  str_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rejectlabel;
  rejectlabel_local = (Label *)pool;
  pool_local = (MyConstPool *)as;
  uVar1 = std::__cxx11::string::size();
  if (uVar1 < 8) {
    local_224 = 0;
    while( true ) {
      pCVar2 = (CodeEmitter *)(long)(int)local_224;
      pCVar3 = (CodeEmitter *)std::__cxx11::string::size();
      if (pCVar3 <= pCVar2) break;
      local_160 = &l1;
      local_168 = 0x262ab8;
      local_16c = 0;
      o0 = (Operand_ *)&l1;
      local_148 = 0x262ab8;
      local_14c = 0;
      signature = 1;
      local_154 = 0;
      local_e0 = &asmjit::NoInit;
      local_80 = &asmjit::NoInit;
      local_40 = 0x262ab8;
      local_18 = 0x262ab8;
      local_1c = 0x1f;
      local_20 = 3;
      local_158 = 0x1000030;
      local_bc = 0x1000032;
      local_c0 = 0;
      local_60 = 0;
      local_50 = 0;
      _l1 = 8.28907076174039e-317;
      local_a0 = 0x262ab8;
      local_22c = 6;
      local_230 = 0;
      local_180._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)pool_local;
      local_180._packed[0].f64 = (UInt64)0x262a58;
      local_188 = &l1;
      local_140 = o0;
      local_d8 = o0;
      local_b8 = o0;
      local_78 = o0;
      local_5c = local_bc;
      local_58 = o0;
      local_4c = local_bc;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)in_stack_fffffffffffffd20,
                 (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                 (Operand_ *)in_stack_fffffffffffffd10,
                 (Operand_ *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      local_130 = pool_local;
      local_138 = 0x262ab8;
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,(Operand_ *)0x18b070);
      pMVar9 = pool_local;
      pbVar4 = (byte *)std::__cxx11::string::operator[](uStack_220);
      local_198 = (Gap *)(asmjit::x86OpData + 0x480);
      local_19c = (uint)*pbVar4;
      local_190 = pMVar9;
      local_10 = local_19c;
      asmjit::CodeEmitter::emit
                (pCVar2,(uint32_t)((ulong)pMVar9 >> 0x20),o0,
                 (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
      local_1c0 = pool_local;
      local_1c8 = str_local;
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,(Operand_ *)0x18b115);
      local_224 = local_224 + 1;
    }
  }
  else {
    local_23c = 0;
    while( true ) {
      uVar1 = (ulong)(int)local_23c;
      uVar5 = std::__cxx11::string::size();
      if (uVar5 <= uVar1) break;
      lVar6 = std::__cxx11::string::size();
      local_248 = lVar6 - (int)local_23c;
      d1.sq[1] = 0x10;
      puVar7 = std::min<unsigned_long>(&local_248,(unsigned_long *)(d1.ub + 8));
      local_240 = (uint32_t)*puVar7;
      for (local_278._20_4_ = 0; o1 = (int)(uVar1 >> 0x20), (int)local_278._20_4_ < (int)local_240;
          local_278._20_4_ = local_278._20_4_ + 1) {
        puVar8 = (undefined1 *)std::__cxx11::string::operator[](uStack_220);
        local_278[(long)(int)local_278._20_4_ + 0x18] = *puVar8;
      }
      pCVar2 = (CodeEmitter *)local_278;
      local_1f0 = 0x262ab8;
      local_1f4 = 0;
      signature_1 = 0;
      as_local._4_4_ = 0;
      local_d0 = &asmjit::NoInit;
      local_90 = &asmjit::NoInit;
      local_38 = 0x262ab8;
      local_28 = 0x262ab8;
      local_2c = 0x1f;
      local_30 = 3;
      as_local._0_4_ = 0x30;
      local_ac = 0x32;
      local_b0 = 0;
      local_70 = 0;
      local_48 = 0;
      local_278._0_8_ = (_func_int **)0x32;
      local_98 = 0x262ab8;
      local_278._12_4_ = 6;
      local_278._8_4_ = 0;
      local_1a8 = pool_local;
      local_1b0 = (Gap *)(asmjit::x86OpData + 0x700);
      local_1b8 = (Gap *)local_278;
      local_1e8 = pCVar2;
      local_c8 = pCVar2;
      local_a8 = pCVar2;
      local_88 = pCVar2;
      local_6c = local_ac;
      local_68 = pCVar2;
      local_44 = local_ac;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)in_stack_fffffffffffffd20,
                 (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20),(Operand_ *)pCVar2,
                 (Operand_ *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      local_298 = stack0xfffffffffffffda0;
      local_290 = d1.sq[0];
      data.sq[1] = (int64_t)stack0xfffffffffffffda0;
      data.sq[0] = (int64_t)rejectlabel_local;
      in_stack_fffffffffffffd18 = pool_local;
      MyConstPool::add((MyConstPool *)local_288,data);
      asmjit::Imm::Imm(&local_2a8,0x18);
      local_108 = 0x262cd8;
      local_110 = local_288;
      local_118 = &local_2a8;
      local_100 = in_stack_fffffffffffffd18;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)in_stack_fffffffffffffd20,
                 (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20),(Operand_ *)pCVar2,
                 (Operand_ *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                 (Operand_ *)0x18b45a);
      in_stack_fffffffffffffd20 = pool_local;
      asmjit::Imm::Imm(&local_2b8,(long)(int)local_240);
      local_f0 = 0x262a68;
      local_f8 = &local_2b8;
      local_e8 = in_stack_fffffffffffffd20;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)in_stack_fffffffffffffd20,
                 (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20),(Operand_ *)pCVar2,
                 (Operand_ *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      local_120 = pool_local;
      local_128 = str_local;
      asmjit::CodeEmitter::emit(pCVar2,in_stack_fffffffffffffd0c,(Operand_ *)0x18b4fe);
      local_1d0 = pool_local;
      local_1d8 = 0x262ab8;
      local_1dc = local_240;
      local_c = local_240;
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffffd40,(uint32_t)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                 in_stack_fffffffffffffd30,o1);
      local_23c = local_23c + 0x10;
    }
  }
  return;
}

Assistant:

void MatchRoutineEM64T<TCHAR>::emit(asmjit::X86Assembler& as, MyConstPool& pool, asmjit::Label& rejectlabel, const std::basic_string<TCHAR>& str)
{
    if (str.size() < 8)
    {
        for (int i = 0; i < str.size(); i++)
        {
            if (sizeof(TCHAR) == 1)
            {
                as.movzx(CHAR_REG, asmjit::x86::byte_ptr(INPUT_REG, 0));
                as.inc(INPUT_REG);
            }
            else
            {
                as.movzx(CHAR_REG, asmjit::x86::word_ptr(INPUT_REG, 0));
                as.add(INPUT_REG, 2);
            }
            as.cmp(CHAR_REG, str[i]);
            as.jne(rejectlabel);
        }
    }
    else
    {
        for (int i = 0; i < str.size(); i += 16 / sizeof(TCHAR))
        {
            int l1 = std::min(str.size() - i, (size_t)(16 / sizeof(TCHAR)));

            asmjit::Data128 d1;

            for (int j = 0; j < l1; j++)
            {
                if (sizeof(TCHAR) == 1)
                    d1.ub[j] = str[i + j];
                else
                    d1.uw[j] = str[i + j];
            }

            as.movdqu(LOAD_REG, asmjit::X86Mem(INPUT_REG, 0));
            as.pcmpistri(LOAD_REG, pool.add(d1), asmjit::Imm(sizeof(TCHAR) == 1 ? 0x18 : 0x19));
            as.cmp(INDEX_REG, asmjit::Imm(l1));
            as.jb(rejectlabel);
            as.add(INPUT_REG, l1);
        }
    }
}